

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_perform_command(connectdata *conn)

{
  undefined4 *puVar1;
  char *local_50;
  char *local_40;
  char *local_30;
  char *command;
  POP3 *pop3;
  SessionHandle *data;
  CURLcode result;
  connectdata *conn_local;
  
  puVar1 = (undefined4 *)(conn->data->req).protop;
  if ((**(char **)(puVar1 + 2) == '\0') || (((conn->data->set).ftp_list_only & 1U) != 0)) {
    local_30 = "LIST";
    if (**(char **)(puVar1 + 2) != '\0') {
      *puVar1 = 1;
    }
  }
  else {
    local_30 = "RETR";
  }
  if (**(char **)(puVar1 + 2) == '\0') {
    if ((*(long *)(puVar1 + 4) == 0) || (**(char **)(puVar1 + 4) == '\0')) {
      local_50 = local_30;
    }
    else {
      local_50 = *(char **)(puVar1 + 4);
    }
    data._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s",local_50);
  }
  else {
    if ((*(long *)(puVar1 + 4) == 0) || (**(char **)(puVar1 + 4) == '\0')) {
      local_40 = local_30;
    }
    else {
      local_40 = *(char **)(puVar1 + 4);
    }
    data._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s %s",local_40,*(undefined8 *)(puVar1 + 2));
  }
  if (data._4_4_ == CURLE_OK) {
    state(conn,POP3_COMMAND);
  }
  return data._4_4_;
}

Assistant:

static CURLcode pop3_perform_command(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct POP3 *pop3 = data->req.protop;
  const char *command = NULL;

  /* Calculate the default command */
  if(pop3->id[0] == '\0' || conn->data->set.ftp_list_only) {
    command = "LIST";

    if(pop3->id[0] != '\0')
      /* Message specific LIST so skip the BODY transfer */
      pop3->transfer = FTPTRANSFER_INFO;
  }
  else
    command = "RETR";

  /* Send the command */
  if(pop3->id[0] != '\0')
    result = Curl_pp_sendf(&conn->proto.pop3c.pp, "%s %s",
                           (pop3->custom && pop3->custom[0] != '\0' ?
                            pop3->custom : command), pop3->id);
  else
    result = Curl_pp_sendf(&conn->proto.pop3c.pp, "%s",
                           (pop3->custom && pop3->custom[0] != '\0' ?
                            pop3->custom : command));

  if(!result)
    state(conn, POP3_COMMAND);

  return result;
}